

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_level.h
# Opt level: O2

void __thiscall FSkillInfo::FSkillInfo(FSkillInfo *this)

{
  (this->Name).Index = 0;
  (this->MenuName).Chars = FString::NullString.Nothing;
  (this->PicName).Chars = FString::NullString.Nothing;
  FString::NullString.RefCount = FString::NullString.RefCount + 2;
  TMap<FName,_FString,_THashTraits<FName>,_TValueTraits<FString>_>::TMap
            (&this->MenuNamesForPlayerClass);
  (this->MustConfirmText).Chars = FString::NullString.Nothing;
  (this->TextColor).Chars = FString::NullString.Nothing;
  FString::NullString.RefCount = FString::NullString.RefCount + 2;
  TMap<FName,_FName,_THashTraits<FName>,_TValueTraits<FName>_>::TMap(&this->Replace);
  TMap<FName,_FName,_THashTraits<FName>,_TValueTraits<FName>_>::TMap(&this->Replaced);
  return;
}

Assistant:

FSkillInfo() {}